

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.h
# Opt level: O0

void __thiscall
CP::priority_queue<int,_std::less<int>_>::push
          (priority_queue<int,_std::less<int>_> *this,int *element)

{
  int *element_local;
  priority_queue<int,_std::less<int>_> *this_local;
  
  if (this->mCap < this->mSize + 1) {
    expand(this,this->mCap << 1);
  }
  this->mData[this->mSize] = *element;
  this->mSize = this->mSize + 1;
  fixUp(this,this->mSize - 1);
  return;
}

Assistant:

void push(const T& element) {
      if (mSize + 1 > mCap)
        expand(mCap * 2);
      mData[mSize] = element;
      mSize++;
      fixUp(mSize-1);
    }